

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image_function_simd.cpp
# Opt level: O3

uint32_t sse::Sum(uint32_t rowSize,uint8_t *imageY,uint8_t *imageYEnd,uint32_t simdWidth,
                 uint32_t totalSimdWidth,uint32_t nonSimdWidth)

{
  undefined1 (*pauVar1) [16];
  bool bVar2;
  undefined8 uVar3;
  byte bVar4;
  byte bVar5;
  long lVar6;
  uint8_t *puVar7;
  ulong uVar8;
  ushort uVar9;
  undefined1 auVar11 [16];
  undefined1 auVar12 [32];
  undefined1 auVar13 [64];
  undefined1 auVar14 [64];
  undefined1 auVar15 [64];
  undefined1 auVar16 [64];
  undefined1 auVar17 [64];
  undefined1 auVar18 [16];
  undefined1 auVar19 [64];
  uint uVar20;
  undefined1 auVar21 [64];
  undefined1 auVar10 [16];
  
  if (imageY == imageYEnd) {
    auVar18 = (undefined1  [16])0x0;
    uVar20 = 0;
  }
  else {
    auVar13 = vpmovsxbq_avx512f(ZEXT816(0xf0e0d0c0b0a0908));
    auVar14 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
    puVar7 = imageY + totalSimdWidth;
    auVar19 = ZEXT1664((undefined1  [16])0x0);
    auVar15 = vpbroadcastq_avx512f();
    uVar20 = 0;
    do {
      if (simdWidth != 0) {
        lVar6 = 0;
        do {
          pauVar1 = (undefined1 (*) [16])(imageY + lVar6);
          lVar6 = lVar6 + 0x10;
          auVar18 = vpmovzxbw_avx(*pauVar1);
          auVar10 = vpunpckhbw_avx(*pauVar1,(undefined1  [16])0x0);
          auVar18 = vpaddw_avx(auVar18,auVar10);
          auVar10 = vpmovzxwd_avx(auVar18);
          auVar18 = vpunpckhwd_avx(auVar18,(undefined1  [16])0x0);
          auVar18 = vpaddd_avx(auVar19._0_16_,auVar18);
          auVar18 = vpaddd_avx(auVar18,auVar10);
          auVar19 = ZEXT1664(auVar18);
        } while ((ulong)simdWidth << 4 != lVar6);
      }
      auVar18 = auVar19._0_16_;
      if (nonSimdWidth != 0) {
        auVar21 = ZEXT464(uVar20);
        uVar8 = 0;
        do {
          auVar16 = vpbroadcastq_avx512f();
          auVar17 = vmovdqa64_avx512f(auVar21);
          auVar21 = vporq_avx512f(auVar16,auVar13);
          auVar16 = vporq_avx512f(auVar16,auVar14);
          uVar3 = vpcmpuq_avx512f(auVar16,auVar15,2);
          bVar4 = (byte)uVar3;
          uVar3 = vpcmpuq_avx512f(auVar21,auVar15,2);
          bVar5 = (byte)uVar3;
          uVar9 = CONCAT11(bVar5,bVar4);
          auVar10 = vmovdqu8_avx512vl(*(undefined1 (*) [16])(puVar7 + uVar8));
          auVar11[1] = ((byte)(uVar9 >> 1) & 1) * auVar10[1];
          auVar11[0] = (bVar4 & 1) * auVar10[0];
          auVar11[2] = ((byte)(uVar9 >> 2) & 1) * auVar10[2];
          auVar11[3] = ((byte)(uVar9 >> 3) & 1) * auVar10[3];
          auVar11[4] = ((byte)(uVar9 >> 4) & 1) * auVar10[4];
          auVar11[5] = ((byte)(uVar9 >> 5) & 1) * auVar10[5];
          auVar11[6] = ((byte)(uVar9 >> 6) & 1) * auVar10[6];
          auVar11[7] = ((byte)(uVar9 >> 7) & 1) * auVar10[7];
          auVar11[8] = (bVar5 & 1) * auVar10[8];
          auVar11[9] = (bVar5 >> 1 & 1) * auVar10[9];
          auVar11[10] = (bVar5 >> 2 & 1) * auVar10[10];
          auVar11[0xb] = (bVar5 >> 3 & 1) * auVar10[0xb];
          auVar11[0xc] = (bVar5 >> 4 & 1) * auVar10[0xc];
          auVar11[0xd] = (bVar5 >> 5 & 1) * auVar10[0xd];
          auVar11[0xe] = (bVar5 >> 6 & 1) * auVar10[0xe];
          auVar11[0xf] = -((char)bVar5 >> 7) * auVar10[0xf];
          uVar8 = uVar8 + 0x10;
          auVar21 = vpmovzxbd_avx512f(auVar11);
          auVar21 = vpaddd_avx512f(auVar17,auVar21);
        } while (((ulong)nonSimdWidth + 0xf & 0xfffffffffffffff0) != uVar8);
        auVar21 = vmovdqa32_avx512f(auVar21);
        auVar16._0_4_ = (uint)(bVar4 & 1) * auVar21._0_4_ | (uint)!(bool)(bVar4 & 1) * auVar17._0_4_
        ;
        bVar2 = (bool)((byte)(uVar9 >> 1) & 1);
        auVar16._4_4_ = (uint)bVar2 * auVar21._4_4_ | (uint)!bVar2 * auVar17._4_4_;
        bVar2 = (bool)((byte)(uVar9 >> 2) & 1);
        auVar16._8_4_ = (uint)bVar2 * auVar21._8_4_ | (uint)!bVar2 * auVar17._8_4_;
        bVar2 = (bool)((byte)(uVar9 >> 3) & 1);
        auVar16._12_4_ = (uint)bVar2 * auVar21._12_4_ | (uint)!bVar2 * auVar17._12_4_;
        bVar2 = (bool)((byte)(uVar9 >> 4) & 1);
        auVar16._16_4_ = (uint)bVar2 * auVar21._16_4_ | (uint)!bVar2 * auVar17._16_4_;
        bVar2 = (bool)((byte)(uVar9 >> 5) & 1);
        auVar16._20_4_ = (uint)bVar2 * auVar21._20_4_ | (uint)!bVar2 * auVar17._20_4_;
        bVar2 = (bool)((byte)(uVar9 >> 6) & 1);
        auVar16._24_4_ = (uint)bVar2 * auVar21._24_4_ | (uint)!bVar2 * auVar17._24_4_;
        bVar2 = (bool)((byte)(uVar9 >> 7) & 1);
        auVar16._28_4_ = (uint)bVar2 * auVar21._28_4_ | (uint)!bVar2 * auVar17._28_4_;
        auVar16._32_4_ =
             (uint)(bVar5 & 1) * auVar21._32_4_ | (uint)!(bool)(bVar5 & 1) * auVar17._32_4_;
        bVar2 = (bool)(bVar5 >> 1 & 1);
        auVar16._36_4_ = (uint)bVar2 * auVar21._36_4_ | (uint)!bVar2 * auVar17._36_4_;
        bVar2 = (bool)(bVar5 >> 2 & 1);
        auVar16._40_4_ = (uint)bVar2 * auVar21._40_4_ | (uint)!bVar2 * auVar17._40_4_;
        bVar2 = (bool)(bVar5 >> 3 & 1);
        auVar16._44_4_ = (uint)bVar2 * auVar21._44_4_ | (uint)!bVar2 * auVar17._44_4_;
        bVar2 = (bool)(bVar5 >> 4 & 1);
        auVar16._48_4_ = (uint)bVar2 * auVar21._48_4_ | (uint)!bVar2 * auVar17._48_4_;
        bVar2 = (bool)(bVar5 >> 5 & 1);
        auVar16._52_4_ = (uint)bVar2 * auVar21._52_4_ | (uint)!bVar2 * auVar17._52_4_;
        bVar2 = (bool)(bVar5 >> 6 & 1);
        auVar16._56_4_ = (uint)bVar2 * auVar21._56_4_ | (uint)!bVar2 * auVar17._56_4_;
        auVar16._60_4_ =
             (uint)(bVar5 >> 7) * auVar21._60_4_ | (uint)!(bool)(bVar5 >> 7) * auVar17._60_4_;
        auVar12 = vextracti64x4_avx512f(auVar16,1);
        auVar21 = vpaddd_avx512f(auVar16,ZEXT3264(auVar12));
        auVar10 = vpaddd_avx(auVar21._0_16_,auVar21._16_16_);
        auVar11 = vpshufd_avx(auVar10,0xee);
        auVar10 = vpaddd_avx(auVar10,auVar11);
        auVar11 = vpshufd_avx(auVar10,0x55);
        auVar10 = vpaddd_avx(auVar10,auVar11);
        uVar20 = auVar10._0_4_;
      }
      imageY = imageY + rowSize;
      puVar7 = puVar7 + rowSize;
    } while (imageY != imageYEnd);
  }
  auVar18 = vphaddd_avx(auVar18,auVar18);
  auVar18 = vphaddd_avx(auVar18,auVar18);
  return auVar18._0_4_ + uVar20;
}

Assistant:

uint32_t Sum( uint32_t rowSize, const uint8_t * imageY, const uint8_t * imageYEnd, uint32_t simdWidth, uint32_t totalSimdWidth, uint32_t nonSimdWidth )
    {
        uint32_t sum = 0;
        simd simdSum = _mm_setzero_si128();
        simd zero    = _mm_setzero_si128();

        for( ; imageY != imageYEnd; imageY += rowSize ) {
            const simd * src    = reinterpret_cast <const simd*> (imageY);
            const simd * srcEnd = src + simdWidth;

            for( ; src != srcEnd; ++src ) {
                simd data = _mm_loadu_si128( src );

                simd dataLo  = _mm_unpacklo_epi8( data, zero );
                simd dataHi  = _mm_unpackhi_epi8( data, zero );
                simd sumLoHi = _mm_add_epi16( dataLo, dataHi );

                simdSum = _mm_add_epi32( simdSum, _mm_add_epi32( _mm_unpacklo_epi16( sumLoHi, zero ),
                                                                 _mm_unpackhi_epi16( sumLoHi, zero ) ) );
            }

            if( nonSimdWidth > 0 ) {
                const uint8_t * imageX    = imageY + totalSimdWidth;
                const uint8_t * imageXEnd = imageX + nonSimdWidth;

                for( ; imageX != imageXEnd; ++imageX )
                    sum += (*imageX);
            }
        }

        uint32_t output[4] ={ 0 };

        _mm_storeu_si128( reinterpret_cast <simd*>(output), simdSum );

        return sum + output[0] + output[1] + output[2] + output[3];
    }